

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O2

bool findDirs(string *path,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *dirsList)

{
  uint uVar1;
  ulong uVar2;
  dirent64 *__ptr;
  bool bVar3;
  dirent **namelist;
  string dirName;
  dirent64 **local_a0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirsList;
  uVar1 = scandir64((path->_M_dataplus)._M_p,&local_a0,(__selector *)0x0,(__cmp *)0x0);
  if (-1 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
    while( true ) {
      bVar3 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar3) break;
      __ptr = local_a0[uVar2];
      if (__ptr->d_type == '\x04') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,__ptr->d_name,(allocator<char> *)&local_70);
        bVar3 = std::operator!=(".",&local_50);
        if (bVar3) {
          bVar3 = std::operator!=("..",&local_50);
          if (bVar3) {
            std::operator+(&local_90,path,&local_50);
            std::operator+(&local_70,&local_90,"/");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_98,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
          }
        }
        std::__cxx11::string::~string((string *)&local_50);
        __ptr = local_a0[uVar2];
      }
      free(__ptr);
    }
    free(local_a0);
  }
  return -1 < (int)uVar1;
}

Assistant:

bool findDirs(const string& path, vector<string>* dirsList)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_DIR)
            {
                string dirName(namelist[n]->d_name);

                // we save only normal ones
                if ("." != dirName && ".." != dirName)
                    dirsList->push_back(path + dirName + "/");
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}